

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall
pbrt::FormattingScene::Accelerator
          (FormattingScene *this,string *name,ParsedParameterVector *params,FileLoc loc)

{
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDI;
  ParameterDictionary dict;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  FormattingScene *in_stack_fffffffffffffed8;
  ParameterDictionary *in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  int in_stack_ffffffffffffff24;
  ParameterDictionary *in_stack_ffffffffffffff28;
  
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(in_RDI,in_RDX);
  ParameterDictionary::ParameterDictionary
            (in_stack_fffffffffffffee0,(ParsedParameterVector *)in_stack_fffffffffffffed8,
             (RGBColorSpace *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(in_stack_fffffffffffffeb0);
  indent_abi_cxx11_(in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
  ParameterDictionary::ToParameterList_abi_cxx11_
            (in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
  Printf<std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffee0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffed8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffed0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffef0);
  ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x4446fa);
  return;
}

Assistant:

void FormattingScene::Accelerator(const std::string &name, ParsedParameterVector params,
                                  FileLoc loc) {
    ParameterDictionary dict(std::move(params), RGBColorSpace::sRGB);

    Printf("%sAccelerator \"%s\"\n%s", indent(), name,
           dict.ToParameterList(catIndentCount));
}